

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

UntypedActionResultHolderBase * __thiscall
testing::internal::FunctionMocker<bool_(unsigned_short)>::UntypedPerformAction
          (FunctionMocker<bool_(unsigned_short)> *this,void *untyped_action,void *untyped_args)

{
  ActionResultHolder<bool> *pAVar1;
  Action<bool_(unsigned_short)> action;
  _Any_data local_30;
  _Manager_type local_20;
  
  std::function<bool_(unsigned_short)>::function
            ((function<bool_(unsigned_short)> *)&local_30,
             (function<bool_(unsigned_short)> *)untyped_action);
  pAVar1 = ActionResultHolder<bool>::PerformAction<bool(unsigned_short)>
                     ((Action<bool_(unsigned_short)> *)&local_30,(ArgumentTuple *)untyped_args);
  if (local_20 != (code *)0x0) {
    (*local_20)(&local_30,&local_30,__destroy_functor);
  }
  return &pAVar1->super_UntypedActionResultHolderBase;
}

Assistant:

UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, void* untyped_args) const override {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    ArgumentTuple* args = static_cast<ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, std::move(*args));
  }